

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

Message * __thiscall
google::protobuf::anon_unknown_19::GeneratedMessageFactory::TryGetPrototype
          (GeneratedMessageFactory *this,Descriptor *type)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  DescriptorPool *pDVar3;
  DescriptorPool *pDVar4;
  LogMessage *pLVar5;
  Message **ppMVar6;
  optional<const_google::protobuf::Message_*> oVar7;
  string_view v;
  LogMessage local_d8;
  Voidify local_c1;
  _Storage<const_google::protobuf::Message_*,_true> local_c0;
  undefined1 local_b8;
  _Storage<const_google::protobuf::Message_*,_true> local_b0;
  undefined1 local_a8;
  WriterMutexLock local_a0;
  WriterMutexLock lock_1;
  LogMessage local_88;
  Voidify local_71;
  string_view local_70;
  DescriptorTable *local_60;
  DescriptorTable *registration_data;
  _Storage<const_google::protobuf::Message_*,_true> local_48;
  undefined1 local_40;
  ReaderMutexLock local_38;
  ReaderMutexLock lock;
  optional<const_google::protobuf::Message_*> result;
  Descriptor *type_local;
  GeneratedMessageFactory *this_local;
  
  std::optional<const_google::protobuf::Message_*>::optional
            ((optional<const_google::protobuf::Message_*> *)&lock);
  absl::lts_20250127::ReaderMutexLock::ReaderMutexLock(&local_38,&this->mutex_);
  oVar7 = FindInTypeMap(this,type);
  local_48 = oVar7.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
             super__Optional_payload_base<const_google::protobuf::Message_*>._M_payload;
  local_40 = oVar7.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
             super__Optional_payload_base<const_google::protobuf::Message_*>._M_engaged;
  lock.mu_ = (Mutex *)local_48;
  bVar1 = std::optional<const_google::protobuf::Message_*>::has_value
                    ((optional<const_google::protobuf::Message_*> *)&lock);
  if ((bVar1) &&
     (ppMVar6 = std::optional<const_google::protobuf::Message_*>::operator*
                          ((optional<const_google::protobuf::Message_*> *)&lock),
     *ppMVar6 != (Message *)0x0)) {
    ppMVar6 = std::optional<const_google::protobuf::Message_*>::operator*
                        ((optional<const_google::protobuf::Message_*> *)&lock);
    this_local = (GeneratedMessageFactory *)*ppMVar6;
    registration_data._0_4_ = 1;
  }
  else {
    registration_data._0_4_ = 0;
  }
  absl::lts_20250127::ReaderMutexLock::~ReaderMutexLock(&local_38);
  if ((int)registration_data == 0) {
    pFVar2 = Descriptor::file(type);
    pDVar3 = FileDescriptor::pool(pFVar2);
    pDVar4 = DescriptorPool::generated_pool();
    if (pDVar3 == pDVar4) {
      pFVar2 = Descriptor::file(type);
      local_70 = FileDescriptor::name(pFVar2);
      local_60 = FindInFileMap(this,local_70);
      if (local_60 == (DescriptorTable *)0x0) {
        absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                  ((LogMessageDebugFatal *)&local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
                   ,0x19a);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar5,(char (*) [61])
                                   "File appears to be in generated pool but wasn\'t registered: ");
        pFVar2 = Descriptor::file(type);
        v = FileDescriptor::name(pFVar2);
        lock_1.mu_ = (Mutex *)v._M_len;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,v);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_71,pLVar5);
        absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                  ((LogMessageDebugFatal *)&local_88);
        this_local = (GeneratedMessageFactory *)0x0;
      }
      else {
        absl::lts_20250127::WriterMutexLock::WriterMutexLock(&local_a0,&this->mutex_);
        oVar7 = FindInTypeMap(this,type);
        local_b0 = oVar7.super__Optional_base<const_google::protobuf::Message_*,_true,_true>.
                   _M_payload.super__Optional_payload_base<const_google::protobuf::Message_*>.
                   _M_payload;
        local_a8 = oVar7.super__Optional_base<const_google::protobuf::Message_*,_true,_true>.
                   _M_payload.super__Optional_payload_base<const_google::protobuf::Message_*>.
                   _M_engaged;
        lock.mu_ = (Mutex *)local_b0;
        bVar1 = std::optional<const_google::protobuf::Message_*>::has_value
                          ((optional<const_google::protobuf::Message_*> *)&lock);
        if (!bVar1) {
          internal::RegisterFileLevelMetadata(local_60);
          oVar7 = FindInTypeMap(this,type);
          local_c0 = oVar7.super__Optional_base<const_google::protobuf::Message_*,_true,_true>.
                     _M_payload.super__Optional_payload_base<const_google::protobuf::Message_*>.
                     _M_payload;
          local_b8 = oVar7.super__Optional_base<const_google::protobuf::Message_*,_true,_true>.
                     _M_payload.super__Optional_payload_base<const_google::protobuf::Message_*>.
                     _M_engaged;
          lock.mu_ = (Mutex *)local_c0;
          bVar1 = std::optional<const_google::protobuf::Message_*>::has_value
                            ((optional<const_google::protobuf::Message_*> *)&lock);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
                       ,0x1aa,"result.has_value()");
            pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d8);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_c1,pLVar5);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_d8);
          }
        }
        absl::lts_20250127::WriterMutexLock::~WriterMutexLock(&local_a0);
        ppMVar6 = std::optional<const_google::protobuf::Message_*>::operator*
                            ((optional<const_google::protobuf::Message_*> *)&lock);
        this_local = (GeneratedMessageFactory *)*ppMVar6;
      }
    }
    else {
      this_local = (GeneratedMessageFactory *)0x0;
    }
  }
  return (Message *)this_local;
}

Assistant:

const Message* GeneratedMessageFactory::TryGetPrototype(
    const Descriptor* type) {
  absl::optional<const Message*> result;
  {
    absl::ReaderMutexLock lock(&mutex_);
    result = FindInTypeMap(type);
    if (result.has_value() && *result != nullptr) {
      return *result;
    }
  }

  // If the type is not in the generated pool, then we can't possibly handle
  // it.
  if (type->file()->pool() != DescriptorPool::generated_pool()) return nullptr;

  // Apparently the file hasn't been registered yet.  Let's do that now.
  const internal::DescriptorTable* registration_data =
      FindInFileMap(type->file()->name());
  if (registration_data == nullptr) {
    ABSL_DLOG(FATAL) << "File appears to be in generated pool but wasn't "
                        "registered: "
                     << type->file()->name();
    return nullptr;
  }

  {
    absl::WriterMutexLock lock(&mutex_);

    // Check if another thread preempted us.
    result = FindInTypeMap(type);
    if (!result.has_value()) {
      // Nope.  OK, register everything.
      internal::RegisterFileLevelMetadata(registration_data);
      // Should be here now.
      result = FindInTypeMap(type);
      ABSL_DCHECK(result.has_value());
    }
  }

  return *result;
}